

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::FormulasLoader::begin__csymbol
          (FormulasLoader *this,csymbol__AttributeData *attributeData)

{
  size_t sVar1;
  UniqueId *pUVar2;
  HelperLoaderBase *in_RDI;
  bool in_stack_000000db;
  ClassId in_stack_000000dc;
  URI *in_stack_000000e0;
  IFilePartLoader *in_stack_000000e8;
  value_type *in_stack_ffffffffffffffc8;
  stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
  *in_stack_ffffffffffffffd0;
  
  if (((ulong)in_RDI[0x11].mHandlingFilePartLoader & 0x100) == 0) {
    std::
    stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
    ::push(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *(undefined1 *)&in_RDI[0x11].mHandlingFilePartLoader = 1;
    sVar1 = COLLADABU::URI::operator_cast_to_unsigned_long((URI *)0xb27d4a);
    if (sVar1 != 0) {
      HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
      COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1002>::ID();
      pUVar2 = IFilePartLoader::createUniqueIdFromUrl
                         (in_stack_000000e8,in_stack_000000e0,in_stack_000000dc,in_stack_000000db);
      in_RDI[0x10]._vptr_HelperLoaderBase = *(_func_int ***)pUVar2;
      in_RDI[0x10].mHandlingFilePartLoader = (FilePartLoader *)pUVar2->mObjectId;
      in_RDI[0x11]._vptr_HelperLoaderBase = (_func_int **)pUVar2->mFileId;
    }
  }
  *(undefined1 *)((long)&in_RDI[0x11].mHandlingFilePartLoader + 1) = 1;
  return true;
}

Assistant:

bool FormulasLoader::begin__csymbol( const csymbol__AttributeData& attributeData )
	{
		if ( !mCurrentApplyHasChild )
		{
			// The csymbol appears as first child of apply. I must be a user defined function.
			mOperatorStack.push(USER_DEFINED_FUNCTION);
			mCurrentCSymbolIsFunction = true;
			if (attributeData.definitionURL)
			{
				mCurrentCSymbolFunctionUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl(attributeData.definitionURL, COLLADAFW::Formula::ID());
			}
		}
		mCurrentApplyHasChild = true;
		return true;
	}